

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

string * __thiscall setup::filename_map::convert(filename_map *this,string *path)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDX;
  long in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  bool in_stack_00000037;
  it *in_stack_00000038;
  filename_map *in_stack_00000040;
  it in_stack_00000048;
  string expanded;
  it begin;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__i;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  string local_68 [32];
  undefined8 local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  char *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  string *path_00;
  
  __first._M_current = in_RDI._M_current;
  path_00 = (string *)in_RDX._M_current;
  if ((*(byte *)(in_RSI + 0x30) & 1) != 0) {
    local_20 = std::__cxx11::string::begin();
    local_28 = std::__cxx11::string::end();
    local_30 = std::__cxx11::string::begin();
    local_38 = (char *)std::
                       transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                 (__first,in_RDI,in_RDX,(_func_int_int *)in_stack_ffffffffffffff50);
  }
  if ((*(byte *)(in_RSI + 0x31) & 1) == 0) {
    std::__cxx11::string::string((string *)in_RDI._M_current,(string *)in_RDX._M_current);
  }
  else {
    local_48 = std::__cxx11::string::begin();
    __i = &local_40;
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              (in_stack_ffffffffffffff50,__i);
    std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              (in_stack_ffffffffffffff50,__i);
    expand_variables(in_stack_00000040,in_stack_00000038,in_stack_00000048,in_stack_00000037);
    shorten_path(path_00);
    std::__cxx11::string::~string(local_68);
  }
  return (string *)__first._M_current;
}

Assistant:

std::string filename_map::convert(std::string path) const {
	
	// Convert paths to lower-case if requested
	if(lowercase) {
		std::transform(path.begin(), path.end(), path.begin(), ::tolower);
	}
	
	// Don't expand variables if requested
	if(!expand) {
		return path;
	}
	
	it begin = path.begin();
	std::string expanded = expand_variables(begin, path.end());
	
	return shorten_path(expanded);
}